

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

bool cycle_values_replace_placeholder_proc(Am_Object *ph,Am_Value *new_value,Am_Object *param_3)

{
  unsigned_short uVar1;
  int iVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  int value;
  Am_Value_List values;
  Am_Value_List local_30;
  
  Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
  pAVar3 = Am_Object::Get(ph,0x169,0);
  Am_Value_List::Am_Value_List(&local_30,pAVar3);
  pAVar3 = Am_Object::Get(ph,0xfb,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  uVar1 = Am_Value_List::Length(&local_30);
  value = iVar2 + 1;
  if ((int)(uVar1 - 1) <= iVar2) {
    value = 0;
  }
  Am_Object::Set(ph,0xfb,value,0);
  pAVar3 = Am_Value_List::Get_Nth(&local_30,value);
  Am_Value::operator=(new_value,pAVar3);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Got value ",10);
    poVar4 = operator<<((ostream *)&std::cout,new_value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," as index ",10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," from list ",0xb);
    poVar4 = operator<<(poVar4,&local_30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," for ",5);
    poVar4 = operator<<(poVar4,ph);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  Am_Value_List::~Am_Value_List(&local_30);
  return true;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 cycle_values_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value,
                  Am_Object & /* sel_widget */))
{
  // if (ph.Get(Am_PLACEHOLDER_INITIALIZED).Valid())
  //   ??should it start list each time initialized??
  ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
  Am_Value_List values = ph.Get(Am_VALUE);
  int count = ph.Get(Am_CURRENT_PHASE);
  //  ************* Beep when done option !!  ****
  if (count >= values.Length() - 1)
    count = 0;
  else
    count++;
  ph.Set(Am_CURRENT_PHASE, count);
  new_value = values.Get_Nth(count);
  if (am_sdebug)
    std::cout << "Got value " << new_value << " as index " << count
              << " from list " << values << " for " << ph << std::endl
              << std::flush;
  return true;
}